

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PacketAllocator.cpp
# Opt level: O0

uint8_t * __thiscall pktalloc::Allocator::fallbackAllocate(Allocator *this,uint bytes)

{
  int iVar1;
  int in_ESI;
  AllocationHeader *regionHeader;
  uint8_t *ptr;
  uint units;
  uint8_t *local_8;
  
  iVar1 = (in_ESI + 0x1fU >> 5) + 1;
  local_8 = SIMDSafeAllocate(CONCAT44(in_ESI,iVar1));
  if (local_8 == (uint8_t *)0x0) {
    local_8 = (uint8_t *)0x0;
  }
  else {
    local_8[0] = '\0';
    local_8[1] = '\0';
    local_8[2] = '\0';
    local_8[3] = '\0';
    local_8[4] = '\0';
    local_8[5] = '\0';
    local_8[6] = '\0';
    local_8[7] = '\0';
    *(int *)(local_8 + 8) = iVar1;
    local_8 = local_8 + 0x20;
  }
  return local_8;
}

Assistant:

uint8_t* Allocator::fallbackAllocate(unsigned bytes)
{
    // Calculate number of units required by this allocation
    // Note: +1 for the AllocationHeader
    const unsigned units = (bytes + kUnitSize - 1) / kUnitSize + 1;

    uint8_t* ptr = SIMDSafeAllocate(kUnitSize * units);
    if (!ptr) {
        return nullptr;
    }

    AllocationHeader* regionHeader = (AllocationHeader*)ptr;
#ifdef PKTALLOC_DEBUG
    regionHeader->Canary = AllocationHeader::kCanaryExpected;
#endif // PKTALLOC_DEBUG
    regionHeader->Header = nullptr;
    regionHeader->UsedUnits = units;

    return ptr + kUnitSize;
}